

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day.h
# Opt level: O0

int __thiscall Day::getLessonsNumber(Day *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_20;
  size_t i;
  int number;
  Day *this_local;
  
  i._4_4_ = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<Lesson,_std::allocator<Lesson>_>::size(&this->lessons);
    if (sVar1 <= local_20) break;
    pvVar2 = std::vector<Lesson,_std::allocator<Lesson>_>::operator[](&this->lessons,local_20);
    if ((pvVar2->exist & 1U) == 1) {
      i._4_4_ = i._4_4_ + 1;
    }
    local_20 = local_20 + 1;
  }
  return i._4_4_;
}

Assistant:

int Day::getLessonsNumber() {
    int number = 0;
    for (size_t i = 0; i < lessons.size(); i++) {
        if(lessons[i].exist == true) {
            number++;
        }
    }
    return number;
}